

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es2pTextureFormatTests.cpp
# Opt level: O3

int __thiscall
deqp::gles2::Performance::TextureFormatTests::init(TextureFormatTests *this,EVP_PKEY_CTX *ctx)

{
  deUint32 format;
  deUint32 dataType;
  Context *context;
  _Alloc_hider description;
  _Alloc_hider name;
  char *__s;
  long *plVar1;
  Texture2DRenderCase *this_00;
  allocator<char> *paVar2;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *extraout_RAX;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar3;
  undefined1 (*pauVar4) [16];
  size_type *psVar5;
  long lVar6;
  int row;
  long lVar7;
  long lVar8;
  long lVar9;
  undefined1 auVar10 [16];
  bool bVar12;
  undefined4 uVar13;
  allocator<char> local_d9;
  undefined1 local_d8 [16];
  undefined1 local_c8 [16];
  undefined4 local_b8;
  string descriptionBase;
  string nameBase;
  long *local_68 [2];
  long local_58 [2];
  int local_48;
  undefined4 uStack_44;
  undefined4 uStack_40;
  undefined4 uStack_3c;
  long lVar11;
  
  lVar9 = 0;
  local_48 = -0x80000000;
  uStack_44 = 0x80000000;
  uStack_40 = 0x80000000;
  uStack_3c = 0x80000000;
  do {
    format = init::texFormats[lVar9].format;
    dataType = init::texFormats[lVar9].dataType;
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&nameBase,init::texFormats[lVar9].name,(allocator<char> *)local_d8);
    __s = glu::getTextureFormatName(format);
    std::__cxx11::string::string<std::allocator<char>>((string *)local_68,__s,&local_d9);
    plVar1 = (long *)std::__cxx11::string::append((char *)local_68);
    local_d8._0_8_ = local_c8;
    pauVar4 = (undefined1 (*) [16])(plVar1 + 2);
    if ((undefined1 (*) [16])*plVar1 == pauVar4) {
      local_c8 = *pauVar4;
    }
    else {
      local_c8._0_8_ = *(long *)*pauVar4;
      local_d8._0_8_ = (undefined1 (*) [16])*plVar1;
    }
    local_d8._8_8_ = plVar1[1];
    *plVar1 = (long)pauVar4;
    plVar1[1] = 0;
    *(undefined1 *)(plVar1 + 2) = 0;
    glu::getTypeName(dataType);
    plVar1 = (long *)std::__cxx11::string::append((char *)local_d8);
    descriptionBase._M_dataplus._M_p = (pointer)&descriptionBase.field_2;
    psVar5 = (size_type *)(plVar1 + 2);
    if ((size_type *)*plVar1 == psVar5) {
      descriptionBase.field_2._M_allocated_capacity = *psVar5;
      descriptionBase.field_2._8_8_ = plVar1[3];
    }
    else {
      descriptionBase.field_2._M_allocated_capacity = *psVar5;
      descriptionBase._M_dataplus._M_p = (pointer)*plVar1;
    }
    descriptionBase._M_string_length = plVar1[1];
    *plVar1 = (long)psVar5;
    plVar1[1] = 0;
    *(undefined1 *)(plVar1 + 2) = 0;
    if ((undefined1 *)local_d8._0_8_ != local_c8) {
      operator_delete((void *)local_d8._0_8_,local_c8._0_8_ + 1);
    }
    if (local_68[0] != local_58) {
      operator_delete(local_68[0],local_58[0] + 1);
    }
    this_00 = (Texture2DRenderCase *)operator_new(0x220);
    name = nameBase._M_dataplus;
    description = descriptionBase._M_dataplus;
    context = (this->super_TestCaseGroup).m_context;
    local_c8 = (undefined1  [16])0x0;
    local_d8 = (undefined1  [16])0x0;
    local_b8 = 0;
    lVar6 = 0;
    lVar7 = 0;
    paVar2 = (allocator<char> *)local_d8;
    do {
      lVar8 = 0;
      auVar10 = _DAT_00632fe0;
      do {
        bVar12 = SUB164(auVar10 ^ _DAT_00625ae0,4) == local_48 &&
                 SUB164(auVar10 ^ _DAT_00625ae0,0) < -0x7ffffffd;
        if (bVar12) {
          uVar13 = 0x3f800000;
          if (lVar6 != lVar8) {
            uVar13 = 0;
          }
          *(undefined4 *)(paVar2 + lVar8) = uVar13;
        }
        if (bVar12) {
          uVar13 = 0x3f800000;
          if (lVar6 + -0xc != lVar8) {
            uVar13 = 0;
          }
          *(undefined4 *)(paVar2 + lVar8 + 0xc) = uVar13;
        }
        lVar11 = auVar10._8_8_;
        auVar10._0_8_ = auVar10._0_8_ + 2;
        auVar10._8_8_ = lVar11 + 2;
        lVar8 = lVar8 + 0x18;
      } while (lVar8 != 0x30);
      lVar7 = lVar7 + 1;
      lVar6 = lVar6 + 0xc;
      paVar2 = paVar2 + 4;
    } while (lVar7 != 3);
    Texture2DRenderCase::Texture2DRenderCase
              (this_00,context,name._M_p,description._M_p,format,dataType,0x812f,0x812f,0x2600,
               0x2600,(Mat3 *)local_d8,1,false);
    tcu::TestNode::addChild((TestNode *)this,(TestNode *)this_00);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)descriptionBase._M_dataplus._M_p != &descriptionBase.field_2) {
      operator_delete(descriptionBase._M_dataplus._M_p,
                      descriptionBase.field_2._M_allocated_capacity + 1);
    }
    paVar3 = &nameBase.field_2;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)nameBase._M_dataplus._M_p != paVar3) {
      operator_delete(nameBase._M_dataplus._M_p,nameBase.field_2._M_allocated_capacity + 1);
      paVar3 = extraout_RAX;
    }
    lVar9 = lVar9 + 1;
  } while (lVar9 != 8);
  return (int)paVar3;
}

Assistant:

void TextureFormatTests::init (void)
{
	static const struct
	{
		const char*	name;
		deUint32	format;
		deUint32	dataType;
	} texFormats[] =
	{
		{ "a8",			GL_ALPHA,			GL_UNSIGNED_BYTE },
		{ "l8",			GL_LUMINANCE,		GL_UNSIGNED_BYTE },
		{ "la88",		GL_LUMINANCE_ALPHA,	GL_UNSIGNED_BYTE },
		{ "rgb565",		GL_RGB,				GL_UNSIGNED_SHORT_5_6_5 },
		{ "rgba4444",	GL_RGBA,			GL_UNSIGNED_SHORT_4_4_4_4 },
		{ "rgba5551",	GL_RGBA,			GL_UNSIGNED_SHORT_5_5_5_1 },
		{ "rgb888",		GL_RGB,				GL_UNSIGNED_BYTE },
		{ "rgba8888",	GL_RGBA,			GL_UNSIGNED_BYTE }
	};

	for (int formatNdx = 0; formatNdx < DE_LENGTH_OF_ARRAY(texFormats); formatNdx++)
	{
		deUint32	format			= texFormats[formatNdx].format;
		deUint32	dataType		= texFormats[formatNdx].dataType;
		string		nameBase		= texFormats[formatNdx].name;
		deUint32	wrapS			= GL_CLAMP_TO_EDGE;
		deUint32	wrapT			= GL_CLAMP_TO_EDGE;
		deUint32	minFilter		= GL_NEAREST;
		deUint32	magFilter		= GL_NEAREST;
		int			numTextures		= 1;
		string		descriptionBase	= string(glu::getTextureFormatName(format)) + ", " + glu::getTypeName(dataType);

		addChild(new Texture2DRenderCase(m_context, nameBase.c_str(), descriptionBase.c_str(), format, dataType, wrapS, wrapT, minFilter, magFilter, tcu::Mat3(), numTextures, false /* npot */));
	}
}